

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall aeron::archive::AeronArchive::checkForErrorResponse(AeronArchive *this)

{
  bool bVar1;
  int iVar2;
  Value VVar3;
  int64_t iVar4;
  ArchiveException *this_00;
  string *__rhs;
  char *pcVar5;
  int in_ECX;
  nfds_t __nfds;
  pollfd *__fds;
  allocator local_ea;
  allocator local_e9;
  unique_lock<std::mutex> lock;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __fds = (pollfd *)&this->lock_;
  std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)__fds);
  iVar2 = ControlResponsePoller::poll
                    ((this->controlResponsePoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                     _M_head_impl,__fds,__nfds,in_ECX);
  if (iVar2 != 0) {
    bVar1 = ControlResponsePoller::isPollComplete
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (bVar1) {
      iVar4 = ControlResponsePoller::controlSessionId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar4 == this->controlSessionId_) {
        iVar4 = ControlResponsePoller::templateId
                          ((this->controlResponsePoller_)._M_t.
                           super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                           _M_head_impl);
        if (iVar4 == 1) {
          VVar3 = ControlResponsePoller::code
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          if (VVar3 == ERROR) {
            this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
            __rhs = ControlResponsePoller::errorMessage_abi_cxx11_
                              ((this->controlResponsePoller_)._M_t.
                               super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               .
                               super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>
                               ._M_head_impl);
            std::operator+(&local_78,"error: ",__rhs);
            std::operator+(&local_58,&local_78,", relevant id: ");
            iVar4 = ControlResponsePoller::relevantId
                              ((this->controlResponsePoller_)._M_t.
                               super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               .
                               super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>
                               ._M_head_impl);
            std::__cxx11::to_string(&local_98,iVar4);
            std::operator+(&local_38,&local_58,&local_98);
            std::__cxx11::string::string
                      ((string *)&local_b8,
                       "void aeron::archive::AeronArchive::checkForErrorResponse()",&local_e9);
            pcVar5 = aeron::util::past_prefix
                               ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                               );
            std::__cxx11::string::string((string *)&local_d8,pcVar5,&local_ea);
            ArchiveException::ArchiveException(this_00,&local_38,&local_b8,&local_d8,0x73);
            __cxa_throw(this_00,&ArchiveException::typeinfo,
                        aeron::util::SourcedException::~SourcedException);
          }
        }
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void AeronArchive::checkForErrorResponse() {
    std::unique_lock<std::mutex> lock(lock_);

    if (controlResponsePoller_->poll() != 0 && controlResponsePoller_->isPollComplete()) {
        if (controlResponsePoller_->controlSessionId() == controlSessionId_ &&
            controlResponsePoller_->templateId() == codecs::ControlResponse::sbeTemplateId() &&
            controlResponsePoller_->code() == codecs::ControlResponseCode::ERROR) {
            throw ArchiveException("error: " + controlResponsePoller_->errorMessage() +
                                       ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                   SOURCEINFO);
        }
    }
}